

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O2

DdNode * Llb_ManComputeIndCase_rec(Aig_Man_t *p,Aig_Obj_t *pObj,DdManager *dd,Vec_Ptr_t *vBdds)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  
  pDVar1 = (DdNode *)Vec_PtrEntry(vBdds,pObj->Id);
  if (pDVar1 == (DdNode *)0x0) {
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Constr.c"
                    ,0x79,
                    "DdNode *Llb_ManComputeIndCase_rec(Aig_Man_t *, Aig_Obj_t *, DdManager *, Vec_Ptr_t *)"
                   );
    }
    pDVar1 = Llb_ManComputeIndCase_rec
                       (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),dd,vBdds);
    pDVar2 = Llb_ManComputeIndCase_rec
                       (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),dd,vBdds);
    pDVar1 = Cudd_bddAnd(dd,(DdNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pDVar1),
                         (DdNode *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pDVar2));
    Cudd_Ref(pDVar1);
    Vec_PtrWriteEntry(vBdds,pObj->Id,pDVar1);
  }
  return pDVar1;
}

Assistant:

DdNode * Llb_ManComputeIndCase_rec( Aig_Man_t * p, Aig_Obj_t * pObj, DdManager * dd, Vec_Ptr_t * vBdds )
{
    DdNode * bBdd0, * bBdd1;
    DdNode * bFunc = (DdNode *)Vec_PtrEntry( vBdds, Aig_ObjId(pObj) );
    if ( bFunc != NULL )
        return bFunc;
    assert( Aig_ObjIsNode(pObj) );
    bBdd0 = Llb_ManComputeIndCase_rec( p, Aig_ObjFanin0(pObj), dd, vBdds ); 
    bBdd1 = Llb_ManComputeIndCase_rec( p, Aig_ObjFanin1(pObj), dd, vBdds ); 
    bBdd0 = Cudd_NotCond( bBdd0, Aig_ObjFaninC0(pObj) );
    bBdd1 = Cudd_NotCond( bBdd1, Aig_ObjFaninC1(pObj) );
    bFunc = Cudd_bddAnd( dd, bBdd0, bBdd1 );  Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    return bFunc;
}